

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBuffer.cpp
# Opt level: O0

void __thiscall ByteBuffer::_init(ByteBuffer *this,bufsize_t *v_size,bufsize_t *v_padding)

{
  BufferException *this_00;
  BYTE *pBVar1;
  QString local_38;
  bufsize_t *local_20;
  bufsize_t *v_padding_local;
  bufsize_t *v_size_local;
  ByteBuffer *this_local;
  
  local_20 = v_padding;
  v_padding_local = v_size;
  v_size_local = (bufsize_t *)this;
  if (*v_size == 0) {
    this_00 = (BufferException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_38,"Zero size requested");
    BufferException::BufferException(this_00,&local_38);
    __cxa_throw(this_00,&BufferException::typeinfo,BufferException::~BufferException);
  }
  pBVar1 = allocContent(this,*v_size,*v_padding);
  this->content = pBVar1;
  if (this->content != (BYTE *)0x0) {
    this->padding = *local_20;
    this->contentSize = *v_padding_local;
    this->originalSize = *v_padding_local;
  }
  return;
}

Assistant:

void ByteBuffer::_init(const bufsize_t& v_size, const bufsize_t& v_padding)
{
    if (v_size == 0) throw BufferException("Zero size requested");

    this->content = allocContent(v_size, v_padding);
    if (this->content) {
        this->padding = v_padding;
        this->contentSize = v_size;
        this->originalSize = v_size;
    }
}